

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool ProvideOption(Option *Handler,StringRef ArgName,StringRef Value,int argc,char **argv,int *i)

{
  int iVar1;
  Child CVar2;
  Child CVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  raw_ostream *Errs;
  int iVar7;
  NodeKind LHSKind;
  uint uVar8;
  char *pcVar9;
  Child CVar10;
  Child CVar11;
  bool bVar12;
  StringRef Value_00;
  StringRef Value_01;
  StringRef Value_02;
  Child local_c8 [2];
  undefined2 local_b8;
  undefined6 uStack_b6;
  Twine local_a8;
  undefined4 local_88;
  undefined4 uStack_84;
  NodeKind local_78;
  char cStack_77;
  undefined6 uStack_76;
  uint local_70;
  undefined4 uStack_6c;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  uint local_58;
  undefined4 uStack_54;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  StringRef local_40;
  
  sVar6 = Value.Length;
  pcVar9 = Value.Data;
  uVar8 = Handler->AdditionalVals;
  uVar5 = *(uint *)&Handler->field_0xc >> 3 & 3;
  local_40.Data = pcVar9;
  local_40.Length = sVar6;
  if (uVar5 == 0) {
    uVar5 = (*Handler->_vptr_Option[1])();
  }
  if (uVar5 == 3) {
    if (uVar8 == 0) {
      if (pcVar9 == (char *)0x0) {
        pcVar9 = (char *)0x0;
        goto LAB_00144055;
      }
      llvm::Twine::Twine((Twine *)&local_58,"does not allow a value! \'");
      llvm::Twine::Twine((Twine *)&local_70,&local_40);
      if ((local_48 == NullKind) || (local_60 == NullKind)) {
        local_b8 = 0x100;
      }
      else if (local_48 == EmptyKind) {
        local_b8._1_1_ = cStack_5f;
        local_b8._0_1_ = local_60;
        uStack_b6 = uStack_5e;
        local_c8[0]._0_4_ = local_70;
        local_c8[0]._4_4_ = uStack_6c;
      }
      else if (local_60 == EmptyKind) {
        local_b8._1_1_ = cStack_47;
        local_b8._0_1_ = local_48;
        uStack_b6 = uStack_46;
        local_c8[0]._0_4_ = local_58;
        local_c8[0]._4_4_ = uStack_54;
      }
      else {
        CVar10._4_4_ = uStack_54;
        CVar10.decUI = local_58;
        if (cStack_47 != '\x01') {
          local_48 = TwineKind;
          CVar10.twine = (Twine *)&local_58;
        }
        if (cStack_5f != '\x01') {
          local_60 = TwineKind;
        }
        CVar3._4_4_ = uStack_6c;
        CVar3.decUI = local_70;
        CVar11.twine = (Twine *)&local_70;
        if (cStack_5f == '\x01') {
          CVar11 = CVar3;
        }
        llvm::Twine::Twine((Twine *)local_c8,CVar10,local_48,CVar11,local_60);
      }
      llvm::Twine::Twine((Twine *)&local_88,"\' specified.");
      if (((NodeKind)local_b8 == NullKind) || (local_78 == NullKind)) {
        local_a8._16_2_ = 0x100;
      }
      else if ((NodeKind)local_b8 == EmptyKind) {
        local_a8.RHSKind = cStack_77;
        local_a8.LHSKind = local_78;
        local_a8._18_6_ = uStack_76;
      }
      else if (local_78 == EmptyKind) {
        local_a8.LHSKind = (NodeKind)local_b8;
        local_a8.RHSKind = local_b8._1_1_;
        local_a8._18_6_ = uStack_b6;
      }
      else {
        CVar11._4_4_ = local_c8[0]._4_4_;
        CVar11.decUI = local_c8[0].decUI;
        LHSKind = (NodeKind)local_b8;
        if (local_b8._1_1_ != EmptyKind) {
          LHSKind = TwineKind;
          CVar11.twine = (Twine *)local_c8;
        }
        if (cStack_77 != '\x01') {
          local_78 = TwineKind;
        }
        CVar2._4_4_ = uStack_84;
        CVar2.decUI = local_88;
        CVar10.twine = (Twine *)&local_88;
        if (cStack_77 == '\x01') {
          CVar10 = CVar2;
        }
        llvm::Twine::Twine(&local_a8,CVar11,LHSKind,CVar10,local_78);
      }
      Errs = llvm::errs();
      goto LAB_00144036;
    }
    pcVar9 = "multi-valued option specified with ValueDisallowed modifier!";
  }
  else {
    if ((uVar5 == 2) && (pcVar9 == (char *)0x0)) {
      iVar1 = *i;
      iVar7 = iVar1 + 1;
      if (argc <= iVar7) {
        pcVar9 = "requires a value!";
        goto LAB_0014401c;
      }
      if (argv == (char **)0x0) {
        __assert_fail("argv && \"null check\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                      ,0x221,
                      "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                     );
      }
      *i = iVar7;
      pcVar9 = argv[(long)iVar1 + 1];
      if (pcVar9 == (char *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(pcVar9);
      }
    }
    if (uVar8 == 0) {
LAB_00144055:
      Value_02.Length = sVar6;
      Value_02.Data = pcVar9;
      bVar12 = CommaSeparateAndAddOccurrence(Handler,*i,ArgName,Value_02,false);
      return bVar12;
    }
    bVar12 = pcVar9 != (char *)0x0;
    if (bVar12) {
      Value_00.Length = sVar6;
      Value_00.Data = pcVar9;
      bVar4 = CommaSeparateAndAddOccurrence(Handler,*i,ArgName,Value_00,false);
      if (bVar4) {
        return true;
      }
      uVar8 = uVar8 - 1;
      if (uVar8 == 0) {
        return false;
      }
    }
    while( true ) {
      uVar8 = uVar8 - 1;
      iVar1 = *i;
      uVar5 = iVar1 + 1;
      if (argc <= (int)uVar5) break;
      if (argv == (char **)0x0) {
        __assert_fail("argv && \"null check\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                      ,0x243,
                      "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                     );
      }
      *i = uVar5;
      pcVar9 = argv[(long)iVar1 + 1];
      if (pcVar9 == (char *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(pcVar9);
      }
      Value_01.Length = sVar6;
      Value_01.Data = pcVar9;
      bVar4 = CommaSeparateAndAddOccurrence(Handler,uVar5,ArgName,Value_01,bVar12);
      if (bVar4) {
        return bVar4;
      }
      bVar12 = true;
      if (uVar8 == 0) {
        return bVar4;
      }
    }
    pcVar9 = "not enough values!";
  }
LAB_0014401c:
  llvm::Twine::Twine(&local_a8,pcVar9);
  Errs = llvm::errs();
LAB_00144036:
  llvm::cl::Option::error(Handler,&local_a8,(StringRef)ZEXT816(0),Errs);
  return true;
}

Assistant:

static inline bool ProvideOption(Option *Handler, StringRef ArgName,
                                 StringRef Value, int argc,
                                 const char *const *argv, int &i) {
  // Is this a multi-argument option?
  unsigned NumAdditionalVals = Handler->getNumAdditionalVals();

  // Enforce value requirements
  switch (Handler->getValueExpectedFlag()) {
  case ValueRequired:
    if (!Value.data()) { // No value specified?
      if (i + 1 >= argc)
        return Handler->error("requires a value!");
      // Steal the next argument, like for '-o filename'
      assert(argv && "null check");
      Value = StringRef(argv[++i]);
    }
    break;
  case ValueDisallowed:
    if (NumAdditionalVals > 0)
      return Handler->error("multi-valued option specified"
                            " with ValueDisallowed modifier!");

    if (Value.data())
      return Handler->error("does not allow a value! '" + Twine(Value) +
                            "' specified.");
    break;
  case ValueOptional:
    break;
  }

  // If this isn't a multi-arg option, just run the handler.
  if (NumAdditionalVals == 0)
    return CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value);

  // If it is, run the handle several times.
  bool MultiArg = false;

  if (Value.data()) {
    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    --NumAdditionalVals;
    MultiArg = true;
  }

  while (NumAdditionalVals > 0) {
    if (i + 1 >= argc)
      return Handler->error("not enough values!");
    assert(argv && "null check");
    Value = StringRef(argv[++i]);

    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    MultiArg = true;
    --NumAdditionalVals;
  }
  return false;
}